

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

void __thiscall
jwt::algorithm::rsa::rsa
          (rsa *this,string *public_key,string *private_key,string *public_key_password,
          string *private_key_password,_func_EVP_MD_ptr *md,string *name)

{
  ulong uVar1;
  rsa_exception *this_00;
  shared_ptr<evp_pkey_st> local_68;
  shared_ptr<evp_pkey_st> local_58 [2];
  _func_EVP_MD_ptr *local_38;
  _func_EVP_MD_ptr *md_local;
  string *private_key_password_local;
  string *public_key_password_local;
  string *private_key_local;
  string *public_key_local;
  rsa *this_local;
  
  local_38 = md;
  md_local = (_func_EVP_MD_ptr *)private_key_password;
  private_key_password_local = public_key_password;
  public_key_password_local = private_key;
  private_key_local = public_key;
  public_key_local = (string *)this;
  std::shared_ptr<evp_pkey_st>::shared_ptr(&this->pkey);
  this->md = local_38;
  std::__cxx11::string::string((string *)&this->alg_name,(string *)name);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    helper::load_private_key_from_string
              ((helper *)local_58,public_key_password_local,(string *)md_local);
    std::shared_ptr<evp_pkey_st>::operator=(&this->pkey,local_58);
    std::shared_ptr<evp_pkey_st>::~shared_ptr(local_58);
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) != 0) {
      this_00 = (rsa_exception *)__cxa_allocate_exception(0x10);
      rsa_exception::rsa_exception
                (this_00,"at least one of public or private key need to be present");
      __cxa_throw(this_00,&rsa_exception::typeinfo,rsa_exception::~rsa_exception);
    }
    helper::load_public_key_from_string
              ((helper *)&local_68,private_key_local,private_key_password_local);
    std::shared_ptr<evp_pkey_st>::operator=(&this->pkey,&local_68);
    std::shared_ptr<evp_pkey_st>::~shared_ptr(&local_68);
  }
  return;
}

Assistant:

rsa(const std::string& public_key, const std::string& private_key, const std::string& public_key_password, const std::string& private_key_password, const EVP_MD*(*md)(), const std::string& name)
				: md(md), alg_name(name)
			{
				if (!private_key.empty()) {
					pkey = helper::load_private_key_from_string(private_key, private_key_password);
				} else if(!public_key.empty()) {
					pkey = helper::load_public_key_from_string(public_key, public_key_password);
				} else
					throw rsa_exception("at least one of public or private key need to be present");
			}